

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,uint length,bool emitUTF8)

{
  Json JVar1;
  bool bVar2;
  uint x;
  uint x_00;
  uint x_01;
  String local_108;
  String local_e8;
  String local_c8;
  undefined4 local_a8;
  undefined4 local_a4;
  uint FIRST_SURROGATE_PAIR_CODEPOINT;
  uint LAST_NON_CONTROL_CODEPOINT;
  uint FIRST_NON_CONTROL_CODEPOINT;
  uint codepoint;
  char *c;
  char *end;
  ulong local_80;
  size_type maxsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_1e;
  byte local_1d;
  uint local_1c;
  bool emitUTF8_local;
  Json *pJStack_18;
  uint length_local;
  char *value_local;
  String *result;
  
  local_1c = (uint)value;
  local_1d = (byte)length & 1;
  pJStack_18 = this;
  value_local = (char *)__return_storage_ptr__;
  if (this == (Json *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1e);
    std::allocator<char>::~allocator(&local_1e);
  }
  else {
    bVar2 = isAnyCharRequiredQuoting((char *)this,(ulong)value & 0xffffffff);
    if (bVar2) {
      local_80 = (ulong)(local_1c * 2 + 3);
      end._7_1_ = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      c = (char *)(pJStack_18 + local_1c);
      for (_FIRST_NON_CONTROL_CODEPOINT = pJStack_18; _FIRST_NON_CONTROL_CODEPOINT != (Json *)c;
          _FIRST_NON_CONTROL_CODEPOINT = _FIRST_NON_CONTROL_CODEPOINT + 1) {
        JVar1 = *_FIRST_NON_CONTROL_CODEPOINT;
        if (JVar1 == (Json)0x8) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
        }
        else if (JVar1 == (Json)0x9) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
        }
        else if (JVar1 == (Json)0xa) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
        }
        else if (JVar1 == (Json)0xc) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
        }
        else if (JVar1 == (Json)0xd) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
        }
        else if (JVar1 == (Json)0x22) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
        }
        else if (JVar1 == (Json)0x5c) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
        }
        else if ((local_1d & 1) == 0) {
          LAST_NON_CONTROL_CODEPOINT = utf8ToCodepoint((char **)&FIRST_NON_CONTROL_CODEPOINT,c);
          FIRST_SURROGATE_PAIR_CODEPOINT = 0x20;
          local_a4 = 0x7f;
          local_a8 = 0x10000;
          if ((LAST_NON_CONTROL_CODEPOINT < 0x20) || (0x7f < LAST_NON_CONTROL_CODEPOINT)) {
            if (LAST_NON_CONTROL_CODEPOINT < 0x10000) {
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\u");
              toHex16Bit_abi_cxx11_(&local_c8,(Json *)(ulong)LAST_NON_CONTROL_CODEPOINT,x);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8)
              ;
              std::__cxx11::string::~string((string *)&local_c8);
            }
            else {
              LAST_NON_CONTROL_CODEPOINT = LAST_NON_CONTROL_CODEPOINT - 0x10000;
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\u");
              toHex16Bit_abi_cxx11_
                        (&local_e8,(Json *)(ulong)((LAST_NON_CONTROL_CODEPOINT >> 10) + 0xd800),x_00
                        );
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8)
              ;
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\u");
              toHex16Bit_abi_cxx11_
                        (&local_108,(Json *)(ulong)(LAST_NON_CONTROL_CODEPOINT & 0x3ff | 0xdc00),
                         x_01);
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,(string *)&local_108);
              std::__cxx11::string::~string((string *)&local_108);
            }
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(char)LAST_NON_CONTROL_CODEPOINT);
          }
        }
        else {
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,(char)*_FIRST_NON_CONTROL_CODEPOINT);
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"\"",(allocator<char> *)((long)&maxsize + 7));
      std::operator+(&local_50,&local_70,(char *)pJStack_18);
      std::operator+(__return_storage_ptr__,&local_50,"\"");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&maxsize + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, unsigned length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!isAnyCharRequiredQuoting(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        result += *c;
      } else {
        unsigned int codepoint = utf8ToCodepoint(c, end);
        const unsigned int FIRST_NON_CONTROL_CODEPOINT = 0x20;
        const unsigned int LAST_NON_CONTROL_CODEPOINT = 0x7F;
        const unsigned int FIRST_SURROGATE_PAIR_CODEPOINT = 0x10000;
        // don't escape non-control characters
        // (short escape sequence are applied above)
        if (FIRST_NON_CONTROL_CODEPOINT <= codepoint &&
            codepoint <= LAST_NON_CONTROL_CODEPOINT) {
          result += static_cast<char>(codepoint);
        } else if (codepoint <
                   FIRST_SURROGATE_PAIR_CODEPOINT) { // codepoint is in Basic
                                                     // Multilingual Plane
          result += "\\u";
          result += toHex16Bit(codepoint);
        } else { // codepoint is not in Basic Multilingual Plane
                 // convert to surrogate pair first
          codepoint -= FIRST_SURROGATE_PAIR_CODEPOINT;
          result += "\\u";
          result += toHex16Bit((codepoint >> 10) + 0xD800);
          result += "\\u";
          result += toHex16Bit((codepoint & 0x3FF) + 0xDC00);
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}